

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O2

rational<unsigned_int> * __thiscall
tcb::rational<unsigned_int>::operator*=(rational<unsigned_int> *this,rational<unsigned_int> *other)

{
  this->num_ = this->num_ * other->num_;
  this->denom_ = this->denom_ * other->denom_;
  simplify(this);
  return this;
}

Assistant:

TCB_CONSTEXPR14 rational& operator*=(const rational<U>& other)
    {
        num_ *= other.num();
        denom_ *= other.denom();
        simplify();
        return *this;
    }